

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_stream.h
# Opt level: O1

OutStream * __thiscall
r_comp::OutStream::insert<std::__cxx11::string>
          (OutStream *this,uint64_t index,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  vector<std::fpos<__mbstate_t>_> *this_00;
  ostringstream *poVar1;
  long lVar2;
  unsigned_short *puVar3;
  fpos<__mbstate_t> *pfVar4;
  long lVar5;
  size_t i;
  ushort uVar6;
  ulong i_00;
  string s;
  char *local_68;
  long local_60;
  char local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar3 = r_code::vector<unsigned_short>::operator[](&this->code_indexes_to_stream_indexes,index);
  uVar6 = *puVar3;
  i_00 = (ulong)uVar6;
  poVar1 = this->stream;
  this_00 = &this->positions;
  pfVar4 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](this_00,i_00);
  std::ostream::seekp(poVar1,pfVar4->_M_off,pfVar4->_M_state);
  std::__cxx11::stringbuf::str();
  r_code::vector<std::fpos<__mbstate_t>_>::operator[](this_00,i_00);
  std::__cxx11::string::substr((ulong)&local_68,(ulong)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this->stream,(t->_M_dataplus)._M_p,t->_M_string_length);
  lVar5 = std::ostream::tellp();
  pfVar4 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](this_00,i_00);
  lVar2 = pfVar4->_M_off;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->stream,local_68,local_60);
  i = (size_t)(uVar6 + 1 & 0xffff);
  if (i < (ulong)((long)(this->positions).m_vector.
                        super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->positions).m_vector.
                        super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    uVar6 = uVar6 + 2;
    do {
      pfVar4 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](this_00,i);
      pfVar4->_M_off = pfVar4->_M_off + (lVar5 - lVar2);
      i = (size_t)uVar6;
      uVar6 = uVar6 + 1;
    } while (i < (ulong)((long)(this->positions).m_vector.
                               super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->positions).m_vector.
                               super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return this;
}

Assistant:

OutStream &insert(uint64_t index, const T &t)   // inserts before code_indexes_to_stream_indexes[index]
    {
        uint16_t stream_index = code_indexes_to_stream_indexes[index];
        stream->seekp(positions[stream_index]);
        std::string s = stream->str().substr(positions[stream_index]);
        *stream << t;
        std::streamoff offset = stream->tellp() - positions[stream_index];
        *stream << s;

        for (uint16_t i = stream_index + 1; i < positions.size(); ++i) { // right-shift
            positions[i] += offset;
        }

        return *this;
    }